

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O0

unsigned_long getRecs(PlayerInfo *player)

{
  string *this;
  Config *this_00;
  unsigned_long uVar1;
  __sv_type _Var2;
  basic_string_view<char,_std::char_traits<char>_> in_key;
  size_t local_20;
  char *local_18;
  PlayerInfo *player_local;
  
  this = (string *)Jupiter::Plugin::getName_abi_cxx11_();
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
  local_20 = _Var2._M_len;
  local_18 = _Var2._M_str;
  this_00 = (Config *)Jupiter::Config::operator[](&player->varData,local_20,local_18);
  in_key = sv("Recs",4);
  uVar1 = Jupiter::Config::get<unsigned_long>(this_00,in_key,0);
  return uVar1;
}

Assistant:

unsigned long getRecs(const RenX::PlayerInfo &player)
{
	return player.varData[pluginInstance.getName()].get<unsigned long>("Recs"sv);
}